

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O1

RealType __thiscall OpenMD::ElementsTable::GetIonization(ElementsTable *this,int atomicnum)

{
  pointer ppEVar1;
  RealType RVar2;
  
  if (this->init_ == false) {
    Init(this);
  }
  RVar2 = 0.0;
  if ((-1 < atomicnum) &&
     (ppEVar1 = (this->elements_).
                super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>._M_impl.
                super__Vector_impl_data._M_start,
     atomicnum <
     (int)((ulong)((long)(this->elements_).
                         super__Vector_base<OpenMD::Element_*,_std::allocator<OpenMD::Element_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1) >> 3))) {
    RVar2 = ppEVar1[(uint)atomicnum]->ionize_;
  }
  return RVar2;
}

Assistant:

RealType ElementsTable::GetIonization(int atomicnum) {
    if (!init_) Init();

    if (atomicnum < 0 || atomicnum >= static_cast<int>(elements_.size()))
      return (0.0);

    return (elements_[atomicnum]->GetIonization());
  }